

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::FocusWindow(ImGuiWindow *window)

{
  ImGuiContext *pIVar1;
  ImGuiID local_1c;
  ImGuiContext *g;
  ImGuiWindow *window_local;
  
  pIVar1 = GImGui;
  if (GImGui->NavWindow != window) {
    GImGui->NavWindow = window;
    if ((window != (ImGuiWindow *)0x0) && ((pIVar1->NavDisableMouseHover & 1U) != 0)) {
      pIVar1->NavMousePosDirty = true;
    }
    pIVar1->NavInitRequest = false;
    if (window == (ImGuiWindow *)0x0) {
      local_1c = 0;
    }
    else {
      local_1c = window->NavLastIds[0];
    }
    pIVar1->NavId = local_1c;
    pIVar1->NavIdIsAlive = false;
    pIVar1->NavLayer = 0;
  }
  if (window != (ImGuiWindow *)0x0) {
    g = (ImGuiContext *)window;
    if (window->RootWindow != (ImGuiWindow *)0x0) {
      g = (ImGuiContext *)window->RootWindow;
    }
    if ((((((g->IO).BackendFlags & 0x4000000U) != 0) && (pIVar1->ActiveId != 0)) &&
        (pIVar1->ActiveIdWindow != (ImGuiWindow *)0x0)) &&
       ((ImGuiContext *)pIVar1->ActiveIdWindow->RootWindow != g)) {
      ClearActiveID();
    }
    if (((g->IO).BackendFlags & 0x2000U) == 0) {
      BringWindowToFront((ImGuiWindow *)g);
    }
  }
  return;
}

Assistant:

void ImGui::FocusWindow(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;

    if (g.NavWindow != window)
    {
        g.NavWindow = window;
        if (window && g.NavDisableMouseHover)
            g.NavMousePosDirty = true;
        g.NavInitRequest = false;
        g.NavId = window ? window->NavLastIds[0] : 0; // Restore NavId
        g.NavIdIsAlive = false;
        g.NavLayer = 0;
        //printf("[%05d] FocusWindow(\"%s\")\n", g.FrameCount, window ? window->Name : NULL);
    }

    // Passing NULL allow to disable keyboard focus
    if (!window)
        return;

    // Move the root window to the top of the pile
    if (window->RootWindow)
        window = window->RootWindow;

    // Steal focus on active widgets
    if (window->Flags & ImGuiWindowFlags_Popup) // FIXME: This statement should be unnecessary. Need further testing before removing it..
        if (g.ActiveId != 0 && g.ActiveIdWindow && g.ActiveIdWindow->RootWindow != window)
            ClearActiveID();

    // Bring to front
    if (!(window->Flags & ImGuiWindowFlags_NoBringToFrontOnFocus))
        BringWindowToFront(window);
}